

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O1

int X509_NAME_add_entry(X509_NAME *name,X509_NAME_ENTRY *ne,int loc,int set)

{
  OPENSSL_STACK *sk;
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  void *pvVar4;
  X509_NAME_ENTRY *a;
  uint uVar5;
  int iVar6;
  size_t i;
  bool bVar7;
  
  if (name == (X509_NAME *)0x0) {
    return 0;
  }
  sk = (OPENSSL_STACK *)name->entries;
  sVar3 = OPENSSL_sk_num(sk);
  uVar2 = (uint)sVar3;
  uVar5 = loc;
  if ((int)uVar2 < loc) {
    uVar5 = uVar2;
  }
  if (loc < 0) {
    uVar5 = uVar2;
  }
  bVar7 = set == 0;
  name->modified = 1;
  if (set == -1) {
    if (uVar5 == 0) {
      bVar7 = true;
      goto LAB_0019fd8a;
    }
    uVar1 = uVar5 - 1;
  }
  else {
    uVar1 = uVar5;
    if ((int)uVar2 <= (int)uVar5) {
      if (uVar5 != 0) {
        pvVar4 = OPENSSL_sk_value(sk,(long)(int)(uVar5 - 1));
        iVar6 = *(int *)((long)pvVar4 + 0x10) + 1;
        goto LAB_0019fd8c;
      }
LAB_0019fd8a:
      iVar6 = 0;
      goto LAB_0019fd8c;
    }
  }
  pvVar4 = OPENSSL_sk_value(sk,(long)(int)uVar1);
  iVar6 = *(int *)((long)pvVar4 + 0x10);
LAB_0019fd8c:
  a = X509_NAME_ENTRY_dup(ne);
  if (a != (X509_NAME_ENTRY *)0x0) {
    a->set = iVar6;
    sVar3 = OPENSSL_sk_insert(sk,a,(long)(int)uVar5);
    if (sVar3 != 0) {
      if (!bVar7) {
        return 1;
      }
      sVar3 = OPENSSL_sk_num(sk);
      if ((int)(uVar5 + 1) < (int)sVar3) {
        i = (size_t)(int)(uVar5 + 1);
        iVar6 = ~uVar5 + (int)sVar3;
        do {
          pvVar4 = OPENSSL_sk_value(sk,i);
          *(int *)((long)pvVar4 + 0x10) = *(int *)((long)pvVar4 + 0x10) + 1;
          i = i + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      return 1;
    }
    X509_NAME_ENTRY_free(a);
  }
  return 0;
}

Assistant:

int X509_NAME_add_entry(X509_NAME *name, const X509_NAME_ENTRY *entry, int loc,
                        int set) {
  X509_NAME_ENTRY *new_name = NULL;
  int i, inc;
  STACK_OF(X509_NAME_ENTRY) *sk;

  if (name == NULL) {
    return 0;
  }
  sk = name->entries;
  int n = (int)sk_X509_NAME_ENTRY_num(sk);
  if (loc > n) {
    loc = n;
  } else if (loc < 0) {
    loc = n;
  }

  inc = (set == 0);
  name->modified = 1;

  if (set == -1) {
    if (loc == 0) {
      set = 0;
      inc = 1;
    } else {
      set = sk_X509_NAME_ENTRY_value(sk, loc - 1)->set;
    }
  } else {  // if (set >= 0)

    if (loc >= n) {
      if (loc != 0) {
        set = sk_X509_NAME_ENTRY_value(sk, loc - 1)->set + 1;
      } else {
        set = 0;
      }
    } else {
      set = sk_X509_NAME_ENTRY_value(sk, loc)->set;
    }
  }

  if ((new_name = X509_NAME_ENTRY_dup(entry)) == NULL) {
    goto err;
  }
  new_name->set = set;
  if (!sk_X509_NAME_ENTRY_insert(sk, new_name, loc)) {
    goto err;
  }
  if (inc) {
    n = (int)sk_X509_NAME_ENTRY_num(sk);
    for (i = loc + 1; i < n; i++) {
      sk_X509_NAME_ENTRY_value(sk, i)->set += 1;
    }
  }
  return 1;
err:
  if (new_name != NULL) {
    X509_NAME_ENTRY_free(new_name);
  }
  return 0;
}